

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  bool bVar1;
  Int32 IVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uVar6;
  int in_EDX;
  Int32 shard_index;
  char *filter;
  bool in_stack_000000ff;
  char *in_stack_00000100;
  char *in_stack_00000108;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  string local_68 [28];
  Int32 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(in_EDX + 1));
  }
  uVar4 = std::__cxx11::string::c_str();
  bVar1 = String::CStringEquals
                    ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     (char *)0x16a281);
  if (!bVar1) {
    ColoredPrintf(COLOR_YELLOW,"Note: %s filter = %s\n","Google Test",uVar4);
  }
  bVar1 = ShouldShard(in_stack_00000108,in_stack_00000100,in_stack_000000ff);
  if (bVar1) {
    IVar2 = Int32FromEnvOrDie(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    pcVar5 = posix::GetEnv((char *)0x16a2eb);
    ColoredPrintf(COLOR_YELLOW,"Note: This is test shard %d of %s.\n",(ulong)(IVar2 + 1),pcVar5);
  }
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    uVar3 = UnitTest::random_seed((UnitTest *)0x16a31b);
    ColoredPrintf(COLOR_YELLOW,"Note: Randomizing tests\' orders with a seed of %d .\n",(ulong)uVar3
                 );
  }
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  UnitTest::test_to_run_count((UnitTest *)0x16a350);
  FormatTestCount_abi_cxx11_(in_stack_ffffffffffffff6c);
  uVar4 = std::__cxx11::string::c_str();
  UnitTest::test_case_to_run_count((UnitTest *)0x16a37d);
  FormatTestCaseCount_abi_cxx11_(in_stack_ffffffffffffff6c);
  uVar6 = std::__cxx11::string::c_str();
  printf("Running %s from %s.\n",uVar4,uVar6);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  const char* const filter = GTEST_FLAG(filter).c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: %s filter = %s\n", GTEST_NAME_, filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const Int32 shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(COLOR_YELLOW,
                  "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG(shuffle)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  fflush(stdout);
}